

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

WriteNLResult *
mp::WriteNLFile<mp::NLW2_NLFeeder_C_Impl>
          (WriteNLResult *__return_storage_ptr__,string *namebase,NLW2_NLFeeder_C_Impl *nlf,
          NLUtils *utl)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  FILE *__stream;
  NLHeader_C h_c;
  undefined1 local_240 [16];
  NLW2_NLFeeder_C_Impl *local_230;
  undefined1 local_228 [144];
  int local_198;
  uint local_194;
  char *local_190;
  int iStack_188;
  uint uStack_184;
  char *local_180;
  char *pcStack_178;
  char *pcStack_170;
  char *local_168;
  char *pcStack_160;
  char *local_158;
  char *pcStack_150;
  char *local_148;
  char *pcStack_140;
  undefined8 local_138;
  char *local_130;
  char *local_128;
  int local_120;
  undefined8 local_11c;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  NLW2_WriteNLResultCode NStack_108;
  undefined4 uStack_104;
  _Alloc_hider local_100;
  _Alloc_hider local_f8;
  undefined1 local_f0 [24];
  undefined1 local_d8 [168];
  
  (*(nlf->nlf2_c_).Header)((NLHeader_C *)local_240,(nlf->nlf2_c_).p_user_data_);
  memcpy(local_d8,(NLHeader_C *)local_240,0xa8);
  pcVar11 = local_138;
  pcVar9 = pcStack_140;
  pcVar8 = local_148;
  pcVar7 = pcStack_150;
  pcVar6 = local_158;
  pcVar5 = pcStack_160;
  pcVar4 = local_168;
  pcVar3 = pcStack_170;
  pcStack_160 = pcStack_178;
  pcVar2 = local_180;
  pcVar1 = (char *)CONCAT44(uStack_184,iStack_188);
  iVar10 = (int)local_138;
  local_11c._0_4_ = local_138._4_4_;
  local_240._0_8_ = utl;
  if (local_198 == 0) {
    memcpy(local_228,local_d8,0xa8);
    pcStack_178 = local_190;
    local_168 = local_180;
    local_158 = pcStack_170;
    pcStack_150 = pcVar4;
    local_148 = pcVar5;
    pcStack_140 = pcVar6;
    local_138 = pcVar7;
    local_240._8_8_ = ((ulong)local_240._8_8_ >> 8 & 0xffffff) << 8;
    local_180 = (char *)((ulong)local_194 << 0x20);
    local_130 = pcVar8;
    local_128 = pcVar9;
    local_120 = iVar10;
    uStack_104 = 0;
    local_100._M_p._0_4_ = NLW2_WriteNL_Unset;
    iStack_114 = 0;
    iStack_110 = 0;
    iStack_10c = 0;
    NStack_108 = NLW2_WriteNL_Unset;
    local_f0._0_8_ = 0;
    local_f0[8] = '\0';
    local_230 = nlf;
    pcStack_170 = pcVar1;
    local_f8._M_p = local_f0 + 8;
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               local_240,namebase);
    if (local_f8._M_p != local_f0 + 8) {
      operator_delete(local_f8._M_p,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
    }
    __stream = (FILE *)CONCAT44(uStack_104,NStack_108);
  }
  else {
    memcpy(&local_230,local_d8,0xa8);
    local_180 = local_190;
    pcStack_170 = pcVar2;
    local_168 = pcStack_178;
    pcStack_160 = pcVar3;
    local_158 = pcVar4;
    pcStack_150 = pcVar5;
    local_148 = pcVar6;
    pcStack_140 = pcVar7;
    iStack_188 = local_198;
    uStack_184 = local_194;
    local_138 = pcVar8;
    local_130 = pcVar9;
    local_128 = pcVar11;
    iStack_10c = 0;
    NStack_108 = NLW2_WriteNL_Unset;
    local_11c._0_4_ = 0;
    local_11c._4_4_ = 0;
    iStack_114 = 0;
    iStack_110 = 0;
    local_f8._M_p = (pointer)0x0;
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffffff00;
    local_240._8_8_ = nlf;
    pcStack_178 = pcVar1;
    local_100._M_p = local_f0;
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFiles
              (__return_storage_ptr__,
               (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)
               local_240,namebase);
    if (local_100._M_p != local_f0) {
      operator_delete(local_100._M_p,local_f0._0_8_ + 1);
    }
    __stream = (FILE *)CONCAT44(iStack_10c,iStack_110);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return __return_storage_ptr__;
}

Assistant:

inline WriteNLResult WriteNLFile(
    const std::string& namebase,
    NLFeeder& nlf, NLUtils& utl) {
  auto h = nlf.Header();
  if (NLHeader::TEXT == h.format) {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::TextFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  } else {
    mp::NLWriter2<
        mp::NLWriter2Params<
        mp::BinaryFormatter, NLFeeder > >
        writer(nlf, h, utl);
    return writer.WriteFiles(namebase);
  }
}